

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O1

JavascriptArray * __thiscall
Js::LazyJSONString::ReconstructArray(LazyJSONString *this,JSONArray *jsonArray)

{
  uint length;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  JavascriptArray *pJVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JSONProperty *prop;
  ulong uVar7;
  
  length = jsonArray->length;
  pJVar4 = JavascriptLibrary::CreateArrayLiteral
                     ((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr,length);
  if ((ulong)length != 0) {
    prop = (JSONProperty *)(jsonArray + 1);
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar7 = 0;
    do {
      pvVar6 = ReconstructVar(this,prop);
      iVar3 = (*(pJVar4->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x29])(pJVar4,uVar7 & 0xffffffff,pvVar6,0);
      if (iVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LazyJSONString.cpp"
                                    ,0x7d,"(result)","result");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      uVar7 = uVar7 + 1;
      prop = prop + 1;
    } while (length != uVar7);
  }
  return pJVar4;
}

Assistant:

JavascriptArray*
LazyJSONString::ReconstructArray(_In_ JSONArray* jsonArray) const
{
    const uint32 length = jsonArray->length;
    JavascriptArray* arr = this->GetLibrary()->CreateArrayLiteral(length);
    JSONProperty* prop = jsonArray->arr;
    for (uint i = 0; i < length; ++i)
    {
        Var element = ReconstructVar(&prop[i]);
        BOOL result = arr->SetItem(i, element, PropertyOperation_None);
        Assert(result); // Setting item in an array we just allocated should always succeed
    }
    return arr;
}